

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor_math.hpp
# Opt level: O0

taylor<taylor<double,_1,_2>,_1,_2> *
operator/(taylor<taylor<double,_1,_2>,_1,_2> *__return_storage_ptr__,
         taylor<taylor<double,_1,_2>,_1,_2> *t,double *x)

{
  taylor<taylor<double,_1,_2>,_1,_2> *tmp;
  taylor<double,_1,_2> local_50;
  int local_34;
  taylor<double,_1,_2> local_30;
  double *local_18;
  double *x_local;
  taylor<taylor<double,_1,_2>,_1,_2> *t_local;
  
  local_18 = x;
  x_local = (double *)t;
  memcpy(__return_storage_ptr__,t,0x48);
  local_34 = 1;
  taylor<double,_1,_2>::taylor<double>(&local_50,local_18);
  operator/(&local_30,&local_34,&local_50);
  taylor<taylor<double,1,2>,1,2>::operator*=
            ((taylor<taylor<double,1,2>,1,2> *)__return_storage_ptr__,&local_30);
  return __return_storage_ptr__;
}

Assistant:

static taylor<T, Nvar, Ndeg> operator/(const taylor<T, Nvar, Ndeg> & t,
                                       const S & x) {
#ifdef TAYLOR_LOGGING
  if (taylor_logging)
    cout << "operator/ by scalar templated. x = " << x << endl;
#endif
  taylor<T, Nvar, Ndeg> tmp = t;
  tmp *= 1 / T(x);
  return tmp;
}